

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O0

char * sndio_get_device(void)

{
  char *dev;
  char *local_8;
  
  local_8 = getenv("AUDIODEVICE");
  if ((local_8 == (char *)0x0) || (*local_8 == '\0')) {
    local_8 = "snd/0";
  }
  return local_8;
}

Assistant:

static const char *
sndio_get_device()
{
#ifdef __linux__
  /*
   * On other platforms default to sndio devices,
   * so cubebs other backends can be used instead.
   */
  const char *dev = getenv("AUDIODEVICE");
  if (dev == NULL || *dev == '\0')
	return "snd/0";
  return dev;
#else
  return SIO_DEVANY;
#endif
}